

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::Clara::addOptName(Arg *arg,string *optName)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  logic_error *plVar4;
  char local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  value_type local_140 [39];
  allocator local_119;
  string local_118 [32];
  string local_f8 [39];
  undefined1 local_d1;
  char local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [55];
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *optName_local;
  Arg *arg_local;
  
  local_18 = optName;
  optName_local = (string *)arg;
  uVar2 = std::__cxx11::string::empty();
  psVar3 = local_18;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"--",&local_39);
    bVar1 = Detail::startsWith(psVar3,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    psVar3 = local_18;
    if (bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        local_d1 = 1;
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )"Only one long opt may be specified. \'");
        std::operator+(local_b0,local_d0);
        std::operator+(local_90,local_b0);
        std::operator+(local_70,(char *)local_90);
        std::logic_error::logic_error(plVar4,(string *)local_70);
        local_d1 = 0;
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::substr((ulong)local_f8,(ulong)local_18);
      std::__cxx11::string::operator=((string *)(optName_local + 0x80),local_f8);
      std::__cxx11::string::~string(local_f8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"-",&local_119);
      bVar1 = Detail::startsWith(psVar3,(string *)local_118);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      if (!bVar1) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_180,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "option must begin with - or --. Option was: \'");
        std::operator+(local_160,local_180);
        std::logic_error::logic_error(plVar4,(string *)local_160);
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      psVar3 = optName_local + 0x68;
      std::__cxx11::string::substr((ulong)local_140,(ulong)local_18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)psVar3,local_140);
      std::__cxx11::string::~string((string *)local_140);
    }
  }
  return;
}

Assistant:

void addOptName( Arg& arg, std::string const& optName )
        {
            if( optName.empty() )
                return;
            if( Detail::startsWith( optName, "--" ) ) {
                if( !arg.longName.empty() )
                    throw std::logic_error( "Only one long opt may be specified. '"
                        + arg.longName
                        + "' already specified, now attempting to add '"
                        + optName + "'" );
                arg.longName = optName.substr( 2 );
            }
            else if( Detail::startsWith( optName, "-" ) )
                arg.shortNames.push_back( optName.substr( 1 ) );
            else
                throw std::logic_error( "option must begin with - or --. Option was: '" + optName + "'" );
        }